

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::objectivec::ParseSimpleFile
               (string *path,LineConsumer *line_consumer,string *out_error)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  int file_descriptor;
  int *piVar4;
  long *plVar5;
  ulong uVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  long *plVar9;
  _func_int **pp_Var10;
  LineConsumer *pLVar11;
  undefined8 uVar12;
  int buf_len;
  Parser parser;
  void *buf;
  FileInputStream file_stream;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0;
  long lStack_1e8;
  StringPiece local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  uint local_1bc;
  long *local_1b8;
  undefined8 local_1b0;
  long local_1a8;
  undefined8 uStack_1a0;
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  undefined1 local_178 [64];
  string local_138;
  ulong *local_118;
  long local_110;
  ulong local_108 [2];
  string local_f8;
  string *local_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  long *local_a8 [2];
  long local_98 [2];
  undefined1 local_88 [16];
  undefined8 local_78;
  long lStack_70;
  
  while( true ) {
    file_descriptor = open((path->_M_dataplus)._M_p,0);
    if (-1 < file_descriptor) break;
    piVar4 = __errno_location();
    if (*piVar4 != 4) {
      local_1e0.ptr_ = (char *)&local_1d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,"error: Unable to open \"","");
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1e0,(ulong)(path->_M_dataplus)._M_p);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_1f0 = *puVar8;
        lStack_1e8 = plVar5[3];
        local_200 = &local_1f0;
      }
      else {
        local_1f0 = *puVar8;
        local_200 = (ulong *)*plVar5;
      }
      local_1f8 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_200);
      pp_Var10 = (_func_int **)(plVar5 + 2);
      if ((_func_int **)*plVar5 == pp_Var10) {
        local_78 = *pp_Var10;
        lStack_70 = plVar5[3];
        local_88._0_8_ = &local_78;
      }
      else {
        local_78 = *pp_Var10;
        local_88._0_8_ = (_func_int **)*plVar5;
      }
      local_88._8_8_ = plVar5[1];
      *plVar5 = (long)pp_Var10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      strerror(*piVar4);
      plVar5 = (long *)std::__cxx11::string::append(local_88);
      pLVar11 = (LineConsumer *)(plVar5 + 2);
      if ((LineConsumer *)*plVar5 == pLVar11) {
        local_178._16_8_ = pLVar11->_vptr_LineConsumer;
        local_178._24_8_ = plVar5[3];
        local_178._0_8_ = local_178 + 0x10;
      }
      else {
        local_178._16_8_ = pLVar11->_vptr_LineConsumer;
        local_178._0_8_ = (LineConsumer *)*plVar5;
      }
      local_178._8_8_ = plVar5[1];
      *plVar5 = (long)pLVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)out_error,(string *)local_178);
      if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
        operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
      }
      if ((undefined8 *)local_88._0_8_ != &local_78) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_78 + 1));
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200,local_1f0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.ptr_ != &local_1d0) {
        operator_delete(local_1e0.ptr_,local_1d0._M_allocated_capacity + 1);
      }
      return false;
    }
  }
  local_d8 = out_error;
  io::FileInputStream::FileInputStream((FileInputStream *)local_88,file_descriptor,-1);
  local_78._0_5_ = CONCAT14(true,(int)local_78);
  local_178._16_8_ = local_178 + 0x20;
  local_178._8_8_ = (ulong)(uint)local_178._12_4_ << 0x20;
  local_178._24_8_ = 0;
  local_178[0x20] = '\0';
  local_178._48_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_178._56_8_ = 0;
  local_138._M_dataplus._M_p = local_178 + 0x50;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_178._0_8_ = line_consumer;
  do {
    do {
      bVar3 = io::FileInputStream::Next((FileInputStream *)local_88,&local_b0,(int *)&local_1bc);
      if (!bVar3) {
        if (local_138._M_string_length == 0) {
          bVar3 = true;
          goto LAB_0023384b;
        }
        std::__cxx11::string::append(local_178 + 0x40);
        sVar2 = local_138._M_string_length;
        _Var1._M_p = local_138._M_dataplus._M_p;
        if ((long)local_138._M_string_length < 0) {
          StringPiece::LogFatalSizeTooBig(local_138._M_string_length,"size_t to int conversion");
        }
        local_178._48_8_ = _Var1._M_p;
        local_178._56_8_ = sVar2;
        bVar3 = anon_unknown_0::Parser::ParseLoop((Parser *)local_178);
        if (!bVar3) goto LAB_00233849;
        bVar3 = local_178._56_8_ == 0;
        goto LAB_0023384b;
      }
      uVar6 = (ulong)local_1bc;
    } while (uVar6 == 0);
    if ((int)local_1bc < 0) {
      __assert_fail("len >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.h"
                    ,0xe4,
                    "google::protobuf::StringPiece::StringPiece(const char *, stringpiece_ssize_type)"
                   );
    }
    local_1e0.ptr_ = (char *)local_b0;
    local_1e0.length_ = uVar6;
    if (local_138._M_string_length == 0) {
      local_178._48_8_ = local_b0;
      local_178._56_8_ = uVar6;
    }
    else {
      StringPiece::AppendToString(&local_1e0,(string *)(local_178 + 0x40));
      sVar2 = local_138._M_string_length;
      _Var1._M_p = local_138._M_dataplus._M_p;
      if ((long)local_138._M_string_length < 0) {
        StringPiece::LogFatalSizeTooBig(local_138._M_string_length,"size_t to int conversion");
      }
      local_178._48_8_ = _Var1._M_p;
      local_178._56_8_ = sVar2;
    }
    bVar3 = anon_unknown_0::Parser::ParseLoop((Parser *)local_178);
    if (local_178._56_8_ == 0) {
      local_138._M_string_length = 0;
      *local_138._M_dataplus._M_p = '\0';
    }
    else {
      local_200 = &local_1f0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._48_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_1f8 = 0;
        local_1f0 = local_1f0 & 0xffffffffffffff00;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_200,local_178._48_8_,
                   (undefined1 *)(local_178._56_8_ + local_178._48_8_));
      }
      std::__cxx11::string::operator=((string *)(local_178 + 0x40),(string *)&local_200);
      if (local_200 != &local_1f0) {
        operator_delete(local_200,local_1f0 + 1);
      }
    }
  } while (bVar3);
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"error: ","");
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)local_a8,(ulong)(path->_M_dataplus)._M_p)
  ;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_c0 = *plVar9;
    lStack_b8 = plVar5[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar9;
    local_d0 = (long *)*plVar5;
  }
  local_c8 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_188 = *puVar8;
    lStack_180 = plVar5[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *puVar8;
    local_198 = (ulong *)*plVar5;
  }
  local_190 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  SimpleItoa_abi_cxx11_(&local_f8,(protobuf *)(local_178._8_8_ & 0xffffffff),(int)local_190);
  uVar6 = 0xf;
  if (local_198 != &local_188) {
    uVar6 = local_188;
  }
  if (uVar6 < local_f8._M_string_length + local_190) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar12 = local_f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_f8._M_string_length + local_190) goto LAB_002335c5;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_198);
  }
  else {
LAB_002335c5:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_f8._M_dataplus._M_p);
  }
  local_1b8 = &local_1a8;
  plVar5 = puVar7 + 2;
  if ((long *)*puVar7 == plVar5) {
    local_1a8 = *plVar5;
    uStack_1a0 = puVar7[3];
  }
  else {
    local_1a8 = *plVar5;
    local_1b8 = (long *)*puVar7;
  }
  local_1b0 = puVar7[1];
  *puVar7 = plVar5;
  puVar7[1] = 0;
  *(undefined1 *)plVar5 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b8);
  puVar8 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_1d0._M_allocated_capacity = *puVar8;
    local_1d0._8_4_ = *(undefined4 *)(puVar7 + 3);
    local_1d0._12_4_ = *(undefined4 *)((long)puVar7 + 0x1c);
    local_1e0.ptr_ = (char *)&local_1d0;
  }
  else {
    local_1d0._M_allocated_capacity = *puVar8;
    local_1e0.ptr_ = (char *)*puVar7;
  }
  local_1e0.length_ = puVar7[1];
  *puVar7 = puVar8;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_178._16_8_,(pointer)(local_178._16_8_ + local_178._24_8_));
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.ptr_ != &local_1d0) {
    uVar12 = local_1d0._M_allocated_capacity;
  }
  if ((ulong)uVar12 < (ulong)(local_110 + local_1e0.length_)) {
    uVar6 = 0xf;
    if (local_118 != local_108) {
      uVar6 = local_108[0];
    }
    if ((ulong)(local_110 + local_1e0.length_) <= uVar6) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_1e0.ptr_);
      goto LAB_00233713;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_118);
LAB_00233713:
  puVar8 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar8) {
    local_1f0 = *puVar8;
    lStack_1e8 = puVar7[3];
    local_200 = &local_1f0;
  }
  else {
    local_1f0 = *puVar8;
    local_200 = (ulong *)*puVar7;
  }
  local_1f8 = puVar7[1];
  *puVar7 = puVar8;
  puVar7[1] = 0;
  *(undefined1 *)puVar8 = 0;
  std::__cxx11::string::operator=((string *)local_d8,(string *)&local_200);
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.ptr_ != &local_1d0) {
    operator_delete(local_1e0.ptr_,local_1d0._M_allocated_capacity + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
LAB_00233849:
  bVar3 = false;
LAB_0023384b:
  if (local_138._M_dataplus._M_p != local_178 + 0x50) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_178._16_8_ != local_178 + 0x20) {
    operator_delete((void *)local_178._16_8_,CONCAT71(local_178._33_7_,local_178[0x20]) + 1);
  }
  io::FileInputStream::~FileInputStream((FileInputStream *)local_88);
  return bVar3;
}

Assistant:

bool ParseSimpleFile(
    const string& path, LineConsumer* line_consumer, string* out_error) {
  int fd;
  do {
    fd = open(path.c_str(), O_RDONLY);
  } while (fd < 0 && errno == EINTR);
  if (fd < 0) {
    *out_error =
        string("error: Unable to open \"") + path + "\", " + strerror(errno);
    return false;
  }
  io::FileInputStream file_stream(fd);
  file_stream.SetCloseOnDelete(true);

  Parser parser(line_consumer);
  const void* buf;
  int buf_len;
  while (file_stream.Next(&buf, &buf_len)) {
    if (buf_len == 0) {
      continue;
    }

    if (!parser.ParseChunk(StringPiece(static_cast<const char*>(buf), buf_len))) {
      *out_error =
          string("error: ") + path +
          " Line " + SimpleItoa(parser.last_line()) + ", " + parser.error_str();
      return false;
    }
  }
  return parser.Finish();
}